

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SongListModel.cpp
# Opt level: O3

void __thiscall SongListModel::moveUp(SongListModel *this,int index)

{
  bool bVar1;
  pointer pSVar2;
  qsizetype qVar3;
  undefined8 uVar4;
  char16_t *pcVar5;
  char16_t *pcVar6;
  Module *this_00;
  SongList *this_01;
  PermanentEditor editor;
  PermanentEditor local_40;
  undefined8 local_28;
  undefined8 local_20;
  undefined8 uStack_18;
  
  local_40.super_Editor.super_QMutexLocker<QMutex>.m = (QMutex *)0xffffffffffffffff;
  local_40.super_Editor.super_QMutexLocker<QMutex>.isLocked = false;
  local_40.super_Editor.super_QMutexLocker<QMutex>._9_7_ = 0;
  local_40.mModule = (Module *)0x0;
  local_28 = 0xffffffffffffffff;
  local_20 = 0;
  uStack_18 = 0;
  QAbstractItemModel::beginMoveRows
            ((QModelIndex *)this,(int)&local_40,index,(QModelIndex *)(ulong)(uint)index,
             (int)&local_28);
  Module::permanentEdit(&local_40,this->mModule);
  this_00 = Module::data(this->mModule);
  this_01 = trackerboy::Module::songs(this_00);
  trackerboy::SongList::moveUp(this_01,index);
  Module::PermanentEditor::~PermanentEditor(&local_40);
  pSVar2 = (this->mSongData).
           super__Vector_base<SongListModel::SongMeta,_std::allocator<SongListModel::SongMeta>_>.
           _M_impl.super__Vector_impl_data._M_start;
  qVar3 = pSVar2[index].name.d.size;
  bVar1 = pSVar2[index].shouldCommit;
  pSVar2[index].name.d.size = pSVar2[(long)index + -1].name.d.size;
  pSVar2[index].shouldCommit = pSVar2[(long)index + -1].shouldCommit;
  uVar4 = pSVar2[index].name.d.d;
  pcVar5 = pSVar2[index].name.d.ptr;
  pcVar6 = pSVar2[(long)index + -1].name.d.ptr;
  pSVar2[index].name.d.d = pSVar2[(long)index + -1].name.d.d;
  pSVar2[index].name.d.ptr = pcVar6;
  pSVar2[(long)index + -1].name.d.d = (Data *)uVar4;
  pSVar2[(long)index + -1].name.d.ptr = pcVar5;
  pSVar2[(long)index + -1].name.d.size = qVar3;
  pSVar2[(long)index + -1].shouldCommit = bVar1;
  QAbstractItemModel::endMoveRows();
  return;
}

Assistant:

void SongListModel::moveUp(int index) {
    beginMoveRows(QModelIndex(), index, index, QModelIndex(), index - 1);
    {
        auto editor = mModule.permanentEdit();
        mModule.data().songs().moveUp(index);
    }

    auto iter = mSongData.begin() + index;
    std::iter_swap(iter, iter - 1);

    endMoveRows();

    
}